

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rma(ASMState *as,x86Op xo,Reg rr,void *addr)

{
  MCode MVar1;
  MCode *pMVar2;
  int iVar3;
  int iVar4;
  lua_State **pplVar5;
  byte *pbVar6;
  MCode *p_1;
  MCode *p;
  uint8_t i8;
  uint64_t dispaddr;
  Reg ra;
  void *addr_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_10;
  
  iVar3 = (int)addr;
  if ((long)addr - (long)&as->J[1].L == (long)(iVar3 - ((int)as->J + 0xca8))) {
    emit_rmro(as,xo,rr,0xe,iVar3 - ((int)as->J + 0xca8));
  }
  else if (((long)addr - (long)as->mcp == (long)(iVar3 - (int)as->mcp)) &&
          ((long)addr - (long)as->mctop == (long)(iVar3 - (int)as->mctop))) {
    emit_rmro(as,xo,rr,0x25,iVar3 - (int)as->mcp);
  }
  else if (addr == (void *)(long)iVar3) {
    pMVar2 = as->mcp;
    *(int *)(pMVar2 + -4) = iVar3;
    pMVar2[-5] = '%';
    pMVar2[-6] = (char)((rr & 7) << 3) + '\x04';
    iVar3 = (int)(char)xo;
    if (iVar3 == -0x3c) {
      *(x86Op *)(pMVar2 + -10) = (rr >> 1 & 4) * 0x2000 ^ xo;
      local_10 = pMVar2 + -10;
    }
    else {
      *(x86Op *)(pMVar2 + -10) = xo;
      pbVar6 = pMVar2 + (iVar3 + -5);
      iVar4 = (rr >> 1 & 0x104) + 0x40;
      _n = pbVar6;
      if (iVar4 != 0x40) {
        as_local._4_1_ = (byte)(rr >> 0x10) | (byte)iVar4;
        if (iVar3 == -4) {
          *pbVar6 = as_local._4_1_;
          as_local._4_1_ = (byte)(xo >> 8);
        }
        else if ((xo & 0xffffff) == 0x6600fd) {
          *pbVar6 = as_local._4_1_;
          as_local._4_1_ = 0x66;
        }
        _n = pbVar6 + -1;
        pbVar6[-1] = as_local._4_1_;
      }
      local_10 = _n;
    }
    as->mcp = local_10;
  }
  else {
    dispaddr._4_4_ = rr & 0xf;
    if (xo != XO_MOV) {
      pplVar5 = &as->J[1].L;
      if (xo == XO_GROUP3b) {
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + 1;
        MVar1 = *pMVar2;
      }
      else {
        MVar1 = '\0';
      }
      dispaddr._4_4_ = 0xe;
      if (pplVar5 == (lua_State **)((ulong)pplVar5 & 0xffffffff)) {
        emit_loadi(as,0xe,(int32_t)pplVar5);
      }
      else {
        pMVar2 = as->mcp;
        *(lua_State ***)(pMVar2 + -8) = pplVar5;
        pMVar2[-9] = 0xbe;
        pMVar2[-10] = 'I';
        as->mcp = pMVar2 + -10;
      }
      if (xo == XO_GROUP3b) {
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + -1;
        pMVar2[-1] = MVar1;
      }
    }
    emit_rmro(as,xo,rr,dispaddr._4_4_,0);
    emit_loadu64(as,dispaddr._4_4_,(uint64_t)addr);
  }
  return;
}

Assistant:

static void emit_rma(ASMState *as, x86Op xo, Reg rr, const void *addr)
{
#if LJ_GC64
  if (checki32(dispofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_DISPATCH, (int32_t)dispofs(as, addr));
  } else if (checki32(mcpofs(as, addr)) && checki32(mctopofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_RIP, (int32_t)mcpofs(as, addr));
  } else if (!checki32((intptr_t)addr)) {
    Reg ra = (rr & 15);
    if (xo != XO_MOV) {
      /* We can't allocate a register here. Use and restore DISPATCH. Ugly. */
      uint64_t dispaddr = (uintptr_t)J2GG(as->J)->dispatch;
      uint8_t i8 = xo == XO_GROUP3b ? *as->mcp++ : 0;
      ra = RID_DISPATCH;
      if (checku32(dispaddr)) {
	emit_loadi(as, ra, (int32_t)dispaddr);
      } else {  /* Full-size 64 bit load. */
	MCode *p = as->mcp;
	*(uint64_t *)(p-8) = dispaddr;
	p[-9] = (MCode)(XI_MOVri+(ra&7));
	p[-10] = 0x48 + ((ra>>3)&1);
	p -= 10;
	as->mcp = p;
      }
      if (xo == XO_GROUP3b) emit_i8(as, i8);
    }
    emit_rmro(as, xo, rr, ra, 0);
    emit_loadu64(as, ra, (uintptr_t)addr);
  } else
#endif
  {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = ptr2addr(addr);
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_ESP, p, -5);
#else
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_EBP, p, -4);
#endif
  }
}